

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult(secp256k1_ecmult_context *ctx,secp256k1_gej *r,secp256k1_gej *a,
                     secp256k1_scalar *na,secp256k1_scalar *ng)

{
  secp256k1_fe *r_00;
  secp256k1_gej *zr_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  secp256k1_gej *a_00;
  long lVar8;
  uint uVar9;
  secp256k1_strauss_point_state *psVar10;
  secp256k1_gej *psVar11;
  secp256k1_ge *psVar12;
  secp256k1_gej *psVar13;
  secp256k1_ge *psVar14;
  long lVar15;
  secp256k1_ge *psVar16;
  secp256k1_gej *a_01;
  long lVar17;
  secp256k1_fe *psVar18;
  long lVar19;
  uint64_t *puVar20;
  int *piVar21;
  bool bVar22;
  byte bVar23;
  uint local_132c;
  secp256k1_ge *local_1328;
  long local_1320;
  long local_1308;
  long local_1300;
  long local_12f8;
  secp256k1_gej *local_12f0;
  secp256k1_fe Z;
  secp256k1_fe local_12a8;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_ge local_1220;
  secp256k1_fe local_11c8;
  secp256k1_fe t;
  secp256k1_fe local_1178;
  secp256k1_fe s2;
  secp256k1_fe u2;
  secp256k1_fe z12;
  secp256k1_fe h2;
  secp256k1_fe az;
  secp256k1_fe i2;
  secp256k1_gej prej [8];
  secp256k1_fe zr [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  int wnaf_ng [256];
  
  bVar23 = 0;
  bVar22 = true;
  local_1320 = 0;
  local_1308 = 1;
  local_1300 = -1;
  lVar15 = 0x100;
  local_12f8 = -0x30;
  psVar10 = ps;
  a_00 = (secp256k1_gej *)(prej[7].z.n + 1);
  local_132c = 0;
  local_12f0 = a_00;
  while (((uVar9 = local_132c, bVar22 && (iVar5 = secp256k1_scalar_is_zero(na), iVar5 == 0)) &&
         (a->infinity == 0))) {
    ps[0].input_pos = 0;
    ps[0].bits_na =
         secp256k1_ecmult_wnaf(psVar10->wnaf_na,(int)na,(secp256k1_scalar *)0x5,(int)a_00);
    if ((int)local_132c < ps[0].bits_na) {
      local_132c = ps[0].bits_na;
    }
    a_00 = (secp256k1_gej *)(ulong)local_132c;
    local_12f0 = (secp256k1_gej *)(local_12f0[2].y.n + 3);
    local_1308 = local_1308 + -8;
    local_1300 = local_1300 + 1;
    local_1320 = local_1320 + 0x2c0;
    lVar15 = lVar15 + -0x400;
    local_12f8 = local_12f8 + 0x400;
    psVar10 = psVar10 + 1;
    bVar22 = false;
  }
  sVar4 = ps[0].input_pos;
  if ((int)local_1320 == 0) {
    Z.n[0] = 1;
    Z.n[1] = 0;
    Z.n[2] = 0;
    Z.n[3] = 0;
    Z.n[4] = 0;
  }
  else {
    a_01 = (secp256k1_gej *)((long)prej - lVar15);
    local_1328 = (secp256k1_ge *)((long)ps[0].wnaf_na + local_1320 + 0x360);
    zr_00 = a + ps[0].input_pos;
    secp256k1_ecmult_odd_multiples_table((int)prej,(secp256k1_gej *)zr,&zr_00->x,a_00);
    psVar10 = ps;
    puVar20 = zr[0].n;
    lVar15 = local_1300;
    while (bVar22 = lVar15 != 0, lVar15 = lVar15 + -1, bVar22) {
      psVar11 = zr_00;
      psVar13 = (secp256k1_gej *)wnaf_ng;
      for (a_00 = (secp256k1_gej *)0x10; a_00 != (secp256k1_gej *)0x0;
          a_00 = (secp256k1_gej *)&a_00[-1].field_0x7f) {
        (psVar13->x).n[0] = (psVar11->x).n[0];
        psVar11 = (secp256k1_gej *)((long)psVar11 + (ulong)bVar23 * -0x10 + 8);
        psVar13 = (secp256k1_gej *)((long)psVar13 + (ulong)bVar23 * -0x10 + 8);
      }
      secp256k1_gej_rescale((secp256k1_gej *)wnaf_ng,(secp256k1_fe *)(puVar20 + -6));
      secp256k1_ecmult_odd_multiples_table
                ((int)puVar20,(secp256k1_gej *)psVar10,(secp256k1_fe *)wnaf_ng,a_00);
      secp256k1_fe_mul((secp256k1_fe *)psVar10,(secp256k1_fe *)psVar10,&a[sVar4].z);
      psVar10 = (secp256k1_strauss_point_state *)(psVar10->wnaf_na + 0x50);
      puVar20 = puVar20 + 0x80;
    }
    uVar1 = *(undefined8 *)((long)az.n + local_12f8 + 8);
    uVar2 = *(undefined8 *)((long)az.n + local_12f8 + 0x10);
    uVar3 = *(undefined8 *)((long)az.n + local_12f8 + 0x18);
    psVar18 = (secp256k1_fe *)((long)ps[0].wnaf_na + local_1320 + 0x3e0);
    *(undefined8 *)((long)ps[0].wnaf_na + local_1320 + 0x3b8) =
         *(undefined8 *)((long)az.n + local_12f8);
    *(undefined8 *)((long)ps[0].wnaf_na + local_1320 + 0x3c0) = uVar1;
    *(undefined8 *)((long)ps[0].wnaf_na + local_1320 + 0x3c8) = uVar2;
    *(undefined8 *)((long)ps[0].wnaf_na + local_1320 + 0x3d0) = uVar3;
    *(undefined8 *)((long)ps[0].wnaf_na + local_1320 + 0x3d8) =
         *(undefined8 *)((long)az.n + local_12f8 + 0x20);
    uVar1 = *(undefined8 *)((long)i2.n + local_12f8 + 8);
    psVar18->n[0] = *(uint64_t *)((long)i2.n + local_12f8);
    *(undefined8 *)((long)ps[0].wnaf_na + local_1320 + 1000) = uVar1;
    uVar1 = *(undefined8 *)((long)i2.n + local_12f8 + 0x18);
    *(undefined8 *)((long)ps[0].wnaf_na + local_1320 + 0x3f0) =
         *(undefined8 *)((long)i2.n + local_12f8 + 0x10);
    *(undefined8 *)((long)ps[0].wnaf_na + local_1320 + 0x3f8) = uVar1;
    *(undefined8 *)((long)&ps[0].bits_na + local_1320) =
         *(undefined8 *)((long)i2.n + local_12f8 + 0x20);
    secp256k1_fe_normalize_weak(psVar18);
    Z.n[0] = *(uint64_t *)((long)prej[0].x.n + local_12f8);
    Z.n[4] = *(uint64_t *)((long)prej[0].x.n + local_12f8 + 0x20);
    Z.n[3] = *(uint64_t *)((long)prej[0].x.n + local_12f8 + 0x18);
    Z.n[2] = *(uint64_t *)((long)prej[0].x.n + local_12f8 + 0x10);
    Z.n[1] = *(uint64_t *)((long)prej[0].x.n + local_12f8 + 8);
    *(undefined4 *)((long)&ps[0].input_pos + local_1320) = 0;
    wnaf_ng._0_8_ = (local_12f0->x).n[0];
    wnaf_ng._8_8_ = (local_12f0->x).n[1];
    wnaf_ng._16_8_ = (local_12f0->x).n[2];
    wnaf_ng._24_8_ = (local_12f0->x).n[3];
    wnaf_ng._32_8_ = (local_12f0->x).n[4];
    lVar15 = 0;
    for (; local_1308 != 0; local_1308 = local_1308 + 1) {
      if (lVar15 != 0) {
        secp256k1_fe_mul((secp256k1_fe *)wnaf_ng,(secp256k1_fe *)wnaf_ng,&local_12f0->x);
      }
      secp256k1_ge_set_gej_zinv(local_1328,a_01,(secp256k1_fe *)wnaf_ng);
      a_01 = a_01 + -1;
      local_1328 = local_1328 + -1;
      local_12f0 = (secp256k1_gej *)(local_12f0[-1].z.n + 1);
      lVar15 = lVar15 + 1;
    }
  }
  if (ng == (secp256k1_scalar *)0x0) {
    local_132c = 0;
  }
  else {
    uVar6 = secp256k1_ecmult_wnaf(wnaf_ng,(int)ng,(secp256k1_scalar *)0xf,(int)a_00);
    bVar22 = (int)local_132c < (int)uVar6;
    local_132c = uVar6;
    if (bVar22) {
      uVar9 = uVar6;
    }
  }
  secp256k1_gej_set_infinity(r);
  psVar18 = &r->y;
  r_00 = &r->z;
  uVar7 = (ulong)uVar9;
  lVar15 = uVar7 * 4;
  while( true ) {
    lVar17 = lVar15 + -4;
    iVar5 = (int)uVar7;
    if (iVar5 < 1) break;
    uVar7 = uVar7 - 1;
    secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
    piVar21 = &ps[0].bits_na;
    psVar16 = pre_a;
    lVar19 = local_1300 + 1;
    while (bVar22 = lVar19 != 0, lVar19 = lVar19 + -1, bVar22) {
      if ((iVar5 <= *piVar21) && (uVar9 = *(uint *)((long)piVar21 + lVar15 + -0x404), uVar9 != 0)) {
        if ((int)uVar9 < 1) {
          psVar12 = psVar16 + (~uVar9 >> 1);
          psVar14 = &local_1220;
          for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
            (psVar14->x).n[0] = (psVar12->x).n[0];
            psVar12 = (secp256k1_ge *)((long)psVar12 + (ulong)bVar23 * -0x10 + 8);
            psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar23 * -0x10 + 8);
          }
          local_1220.y.n[0] = 0x3ffffbfffff0bc - local_1220.y.n[0];
          local_1220.y.n[1] = 0x3ffffffffffffc - local_1220.y.n[1];
          local_1220.y.n[2] = 0x3ffffffffffffc - local_1220.y.n[2];
          local_1220.y.n[3] = 0x3ffffffffffffc - local_1220.y.n[3];
          local_1220.y.n[4] = 0x3fffffffffffc - local_1220.y.n[4];
        }
        else {
          psVar12 = psVar16 + (uVar9 - 1 >> 1);
          psVar14 = &local_1220;
          for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
            (psVar14->x).n[0] = (psVar12->x).n[0];
            psVar12 = (secp256k1_ge *)((long)psVar12 + (ulong)bVar23 * -0x10 + 8);
            psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar23 * -0x10 + 8);
          }
        }
        secp256k1_gej_add_ge_var(r,r,&local_1220,(secp256k1_fe *)0x0);
      }
      psVar16 = psVar16 + 8;
      piVar21 = piVar21 + 0x104;
    }
    lVar15 = lVar17;
    if ((iVar5 <= (int)local_132c) && (uVar9 = wnaf_ng[uVar7], uVar9 != 0)) {
      if ((int)uVar9 < 1) {
        secp256k1_ge_from_storage
                  (&local_1220,(secp256k1_ge_storage *)(ctx->pre_g + (ulong)(~uVar9 >> 1) * 0x40));
        local_1220.y.n[0] = 0x3ffffbfffff0bc - local_1220.y.n[0];
        local_1220.y.n[1] = 0x3ffffffffffffc - local_1220.y.n[1];
        local_1220.y.n[2] = 0x3ffffffffffffc - local_1220.y.n[2];
        local_1220.y.n[3] = 0x3ffffffffffffc - local_1220.y.n[3];
        local_1220.y.n[4] = 0x3fffffffffffc - local_1220.y.n[4];
      }
      else {
        secp256k1_ge_from_storage
                  (&local_1220,(secp256k1_ge_storage *)(ctx->pre_g + (ulong)(uVar9 - 1 >> 1) * 0x40)
                  );
      }
      if (local_1220.infinity == 0) {
        if (r->infinity == 0) {
          secp256k1_fe_mul(&az,r_00,&Z);
          secp256k1_fe_sqr(&z12,&az);
          u1.n[4] = (r->x).n[4];
          u1.n[0] = (r->x).n[0];
          u1.n[1] = (r->x).n[1];
          u1.n[2] = (r->x).n[2];
          u1.n[3] = (r->x).n[3];
          secp256k1_fe_normalize_weak(&u1);
          secp256k1_fe_mul(&u2,&local_1220.x,&z12);
          s1.n[4] = (r->y).n[4];
          s1.n[0] = psVar18->n[0];
          s1.n[1] = (r->y).n[1];
          s1.n[2] = (r->y).n[2];
          s1.n[3] = (r->y).n[3];
          secp256k1_fe_normalize_weak(&s1);
          secp256k1_fe_mul(&s2,&local_1220.y,&z12);
          secp256k1_fe_mul(&s2,&s2,&az);
          local_1178.n[0] = (u2.n[0] - u1.n[0]) + 0x3ffffbfffff0bc;
          local_1178.n[1] = (u2.n[1] - u1.n[1]) + 0x3ffffffffffffc;
          local_1178.n[2] = (u2.n[2] - u1.n[2]) + 0x3ffffffffffffc;
          local_1178.n[3] = (u2.n[3] - u1.n[3]) + 0x3ffffffffffffc;
          local_1178.n[4] = (u2.n[4] - u1.n[4]) + 0x3fffffffffffc;
          local_11c8.n[0] = (s2.n[0] - s1.n[0]) + 0x3ffffbfffff0bc;
          local_11c8.n[1] = (s2.n[1] - s1.n[1]) + 0x3ffffffffffffc;
          local_11c8.n[2] = (s2.n[2] - s1.n[2]) + 0x3ffffffffffffc;
          local_11c8.n[3] = (s2.n[3] - s1.n[3]) + 0x3ffffffffffffc;
          local_11c8.n[4] = (s2.n[4] - s1.n[4]) + 0x3fffffffffffc;
          iVar5 = secp256k1_fe_normalizes_to_zero_var(&local_1178);
          if (iVar5 == 0) {
            secp256k1_fe_sqr(&i2,&local_11c8);
            secp256k1_fe_sqr(&h2,&local_1178);
            secp256k1_fe_mul(&local_12a8,&local_1178,&h2);
            secp256k1_fe_mul(r_00,r_00,&local_1178);
            secp256k1_fe_mul(&t,&u1,&h2);
            (r->x).n[4] = t.n[4];
            (r->x).n[2] = t.n[2];
            (r->x).n[3] = t.n[3];
            (r->x).n[0] = t.n[0];
            (r->x).n[1] = t.n[1];
            secp256k1_fe_mul_int(&r->x,2);
            secp256k1_fe_add(&r->x,&local_12a8);
            secp256k1_fe_negate(&r->x,&r->x,3);
            secp256k1_fe_add(&r->x,&i2);
            secp256k1_fe_negate(psVar18,&r->x,5);
            secp256k1_fe_add(psVar18,&t);
            secp256k1_fe_mul(psVar18,psVar18,&local_11c8);
            secp256k1_fe_mul(&local_12a8,&local_12a8,&s1);
            local_12a8.n[0] = 0x3ffffbfffff0bc - local_12a8.n[0];
            local_12a8.n[1] = 0x3ffffffffffffc - local_12a8.n[1];
            local_12a8.n[2] = 0x3ffffffffffffc - local_12a8.n[2];
            local_12a8.n[3] = 0x3ffffffffffffc - local_12a8.n[3];
            local_12a8.n[4] = 0x3fffffffffffc - local_12a8.n[4];
            secp256k1_fe_add(psVar18,&local_12a8);
          }
          else {
            iVar5 = secp256k1_fe_normalizes_to_zero_var(&local_11c8);
            if (iVar5 == 0) {
              secp256k1_gej_set_infinity(r);
            }
            else {
              secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
            }
          }
        }
        else {
          r->infinity = 0;
          secp256k1_fe_sqr(&az,&Z);
          secp256k1_fe_mul(&z12,&az,&Z);
          secp256k1_fe_mul(&r->x,&local_1220.x,&az);
          secp256k1_fe_mul(psVar18,&local_1220.y,&z12);
          (r->z).n[0] = 1;
          (r->z).n[3] = 0;
          (r->z).n[4] = 0;
          (r->z).n[1] = 0;
          (r->z).n[2] = 0;
        }
      }
    }
  }
  if (r->infinity == 0) {
    secp256k1_fe_mul(r_00,r_00,&Z);
  }
  return;
}

Assistant:

static void secp256k1_ecmult(const secp256k1_ecmult_context *ctx, secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_gej prej[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_fe zr[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
#ifdef USE_ENDOMORPHISM
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
#endif
    struct secp256k1_strauss_state state;

    state.prej = prej;
    state.zr = zr;
    state.pre_a = pre_a;
#ifdef USE_ENDOMORPHISM
    state.pre_a_lam = pre_a_lam;
#endif
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(ctx, &state, r, 1, a, na, ng);
}